

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall tetgenio::load_medit(tetgenio *this,char *filebasename,int istetmesh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  size_t sVar4;
  FILE *__stream;
  tetgenio *ptVar5;
  long lVar6;
  char *pcVar7;
  double *pdVar8;
  tetgenio *ptVar9;
  long lVar10;
  int *piVar11;
  facet *pfVar12;
  facet *pfVar13;
  long lVar14;
  facet *pfVar15;
  polygon *ppVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  char *pcVar20;
  ulong uVar21;
  bool bVar22;
  double dVar23;
  ulong uStack_cb0;
  int line_count;
  tetgenio *local_ca0;
  facet *local_c98;
  ulong local_c90;
  int local_c84;
  ulong local_c80;
  long local_c78;
  long local_c70;
  tetgenio *local_c68;
  long local_c60;
  long local_c58;
  ulong local_c50;
  tetgenio *local_c48;
  undefined8 local_c40;
  char infilename [1024];
  char buffer [2048];
  
  line_count = 0;
  strncpy(infilename,filebasename,0x3ff);
  infilename[0x3ff] = '\0';
  if (infilename[0] == '\0') {
    puts("Error:  No filename.");
    bVar22 = false;
  }
  else {
    sVar4 = strlen(infilename);
    iVar3 = strcmp(infilename + (sVar4 - 5),".mesh");
    if (iVar3 != 0) {
      sVar4 = strlen(infilename);
      builtin_strncpy(infilename + sVar4,".mesh",6);
    }
    __stream = fopen(infilename,"r");
    if (__stream == (FILE *)0x0) {
      bVar22 = false;
      printf("Error:  Unable to open file %s\n",infilename);
    }
    else {
      pcVar20 = "Opening %s.\n";
      printf("Opening %s.\n",infilename);
      local_c40 = 0x3fffffff8;
      local_c50 = 0;
      local_c70 = 0;
      local_c58 = 0;
      uVar19 = 0;
      lVar6 = 0;
LAB_0010a31c:
      local_c78 = lVar6;
      ppVar16 = (polygon *)&line_count;
      ptVar5 = (tetgenio *)readline((tetgenio *)pcVar20,buffer,(FILE *)__stream,(int *)ppVar16);
      if (ptVar5 != (tetgenio *)0x0) {
        lVar6 = local_c78;
        if ((char)ptVar5->firstnumber != '#') {
          bVar22 = (int)local_c78 == 0;
          local_ca0 = ptVar5;
          if (bVar22) {
            ptVar9 = ptVar5;
            pcVar20 = strstr((char *)ptVar5,"Dimension");
            if (((pcVar20 == (char *)0x0) &&
                (ptVar9 = ptVar5, pcVar20 = strstr((char *)ptVar5,"dimension"),
                pcVar20 == (char *)0x0)) &&
               (pcVar20 = strstr((char *)ptVar5,"DIMENSION"), ptVar9 = ptVar5,
               pcVar20 == (char *)0x0)) {
              local_c78 = 0;
              pcVar20 = (char *)ptVar5;
            }
            else {
              pcVar20 = findnextnumber(ptVar9,pcVar20);
              if ((char)((tetgenio *)pcVar20)->firstnumber == '\0') {
                local_ca0 = (tetgenio *)pcVar20;
                pcVar20 = readline(ptVar9,buffer,(FILE *)__stream,&line_count);
              }
              local_ca0 = (tetgenio *)pcVar20;
              lVar6 = strtol(pcVar20,(char **)&local_ca0,0);
              uVar17 = (int)lVar6 - 4;
              ppVar16 = (polygon *)(ulong)uVar17;
              if (uVar17 < 0xfffffffe) {
                uVar21 = (ulong)(uint)line_count;
                pcVar20 = "Unknown dimension in file on line %d in file %s\n";
                goto LAB_0010ad0b;
              }
              this->mesh_dim = (int)lVar6;
              local_c78 = lVar6;
            }
          }
          ptVar5 = local_ca0;
          if (((int)local_c50 == 0) &&
             (((ptVar9 = local_ca0, pcVar7 = strstr((char *)local_ca0,"Vertices"),
               pcVar7 != (char *)0x0 ||
               (ptVar9 = ptVar5, pcVar7 = strstr((char *)ptVar5,"vertices"), pcVar7 != (char *)0x0))
              || (pcVar7 = strstr((char *)ptVar5,"VERTICES"), pcVar20 = (char *)ptVar5,
                 ptVar9 = ptVar5, pcVar7 != (char *)0x0)))) {
            pcVar20 = findnextnumber(ptVar9,pcVar7);
            lVar6 = local_c78;
            if ((char)((tetgenio *)pcVar20)->firstnumber == '\0') {
              local_ca0 = (tetgenio *)pcVar20;
              pcVar20 = readline(ptVar9,buffer,(FILE *)__stream,&line_count);
            }
            local_ca0 = (tetgenio *)pcVar20;
            uVar21 = strtol(pcVar20,(char **)&local_ca0,0);
            iVar3 = (int)uVar21;
            if (0 < iVar3) {
              this->numberofpoints = iVar3;
              pcVar20 = (char *)(uVar21 * 0x18 & 0x7fffffff8);
              pdVar8 = (double *)operator_new__((ulong)pcVar20);
              this->pointlist = pdVar8;
            }
            uVar19 = iVar3 + 1;
            local_c80 = 0;
            if (0 < iVar3) {
              local_c80 = uVar21 & 0xffffffff;
            }
            local_c98 = (facet *)0x0;
            uVar18 = 0;
            local_c84 = istetmesh;
            local_c68 = this;
            local_c50 = uVar21;
            while (ptVar5 = local_c68, this = local_c68, istetmesh = local_c84, uVar18 != local_c80)
            {
              local_c90 = uVar18;
              ptVar9 = (tetgenio *)readline((tetgenio *)pcVar20,buffer,(FILE *)__stream,&line_count)
              ;
              uVar21 = local_c90;
              local_ca0 = ptVar9;
              if (ptVar9 == (tetgenio *)0x0) goto LAB_0010ad52;
              pdVar8 = ptVar5->pointlist;
              lVar6 = (long)pdVar8 + (long)local_c98;
              for (lVar14 = 0; local_ca0 = ptVar9, lVar14 != 3; lVar14 = lVar14 + 1) {
                if ((char)ptVar9->firstnumber == '\0') {
                  printf("Syntax error reading vertex coords on line");
                  uVar21 = (ulong)(uint)line_count;
                  pcVar20 = " %d in file %s\n";
                  goto LAB_0010ad0b;
                }
                if ((lVar14 == 2) && ((int)local_c78 != 3)) {
                  pdVar8[uVar21 * 3 + 2] = 0.0;
                }
                else {
                  dVar23 = strtod((char *)ptVar9,(char **)&local_ca0);
                  *(double *)(lVar6 + lVar14 * 8) = dVar23;
                  pcVar20 = (char *)ptVar9;
                }
                ptVar9 = (tetgenio *)findnextnumber((tetgenio *)pcVar20,(char *)local_ca0);
              }
              local_c98 = (facet *)&((polygon *)((long)local_c98 + 0x10))->numberofvertices;
              lVar6 = local_c78;
              uVar18 = local_c90 + 1;
            }
            goto LAB_0010a31c;
          }
          ptVar5 = local_ca0;
          if ((int)local_c58 == 0) {
            ptVar9 = local_ca0;
            pcVar20 = strstr((char *)local_ca0,"Tetrahedra");
            local_c84 = istetmesh;
            if (((pcVar20 == (char *)0x0) &&
                (ptVar9 = ptVar5, pcVar20 = strstr((char *)ptVar5,"tetrahedra"),
                pcVar20 == (char *)0x0)) &&
               (pcVar20 = strstr((char *)ptVar5,"TETRAHEDRA"), ptVar9 = ptVar5,
               pcVar20 == (char *)0x0)) {
              lVar6 = 0;
              local_c58 = 0;
            }
            else {
              ptVar5 = (tetgenio *)findnextnumber(ptVar9,pcVar20);
              if ((char)ptVar5->firstnumber == '\0') {
                local_ca0 = ptVar5;
                ptVar5 = (tetgenio *)readline(ptVar9,buffer,(FILE *)__stream,&line_count);
              }
              local_ca0 = ptVar5;
              lVar6 = strtol((char *)ptVar5,(char **)&local_ca0,0);
              uVar17 = (uint)lVar6;
              local_c58 = lVar6;
              if (0 < (int)uVar17) {
                this->numberoftetrahedra = uVar17;
                this->numberofcorners = 4;
                this->numberoftetrahedronattributes = 1;
                piVar11 = (int *)operator_new__((ulong)(uVar17 & 0x3fffffff) << 4);
                this->tetrahedronlist = piVar11;
                ptVar5 = (tetgenio *)(lVar6 << 3 & local_c40);
                pdVar8 = (double *)operator_new__((ulong)ptVar5);
                this->tetrahedronattributelist = pdVar8;
              }
              lVar6 = 4;
            }
            local_c90 = 0;
            ppVar16 = (polygon *)0x0;
            local_c68 = this;
            while (pcVar20 = (char *)ptVar5, istetmesh = local_c84,
                  (long)ppVar16 < (long)this->numberoftetrahedra) {
              piVar11 = this->tetrahedronlist;
              local_c98 = (facet *)ppVar16;
              ptVar9 = (tetgenio *)readline(ptVar5,buffer,(FILE *)__stream,&line_count);
              uVar21 = local_c90;
              local_ca0 = ptVar9;
              if (ptVar9 == (tetgenio *)0x0) goto LAB_0010ad52;
              for (lVar14 = 0; this = local_c68, local_ca0 = ptVar9, lVar6 != lVar14;
                  lVar14 = lVar14 + 1) {
                if ((char)ptVar9->firstnumber == '\0') goto LAB_0010acfd;
                lVar10 = strtol((char *)ptVar9,(char **)&local_ca0,0);
                uVar17 = (uint)lVar10;
                *(uint *)((long)piVar11 + lVar14 * 4 + uVar21) = uVar17;
                if ((int)uVar19 < (int)uVar17) {
                  uVar17 = uVar19;
                }
                uVar19 = uVar17;
                ptVar5 = ptVar9;
                ptVar9 = (tetgenio *)findnextnumber(ptVar9,(char *)local_ca0);
              }
              local_c68->tetrahedronattributelist[(long)local_c98] = 0.0;
              if ((char)ptVar9->firstnumber != '\0') {
                lVar14 = strtol((char *)ptVar9,(char **)&local_ca0,0);
                this->tetrahedronattributelist[(long)local_c98] = (double)lVar14;
                ptVar5 = ptVar9;
              }
              local_c90 = local_c90 + 0x10;
              ppVar16 = (polygon *)((long)&local_c98->polygonlist + 1);
            }
          }
          ptVar5 = local_ca0;
          lVar6 = local_c78;
          if ((int)local_c70 == 0) {
            ptVar9 = local_ca0;
            pcVar7 = strstr((char *)local_ca0,"Triangles");
            local_c90 = CONCAT44(local_c90._4_4_,(int)CONCAT71((int7)((ulong)ppVar16 >> 8),1));
            if (((pcVar7 == (char *)0x0) &&
                (ptVar9 = ptVar5, pcVar7 = strstr((char *)ptVar5,"triangles"), pcVar7 == (char *)0x0
                )) && (ptVar9 = ptVar5, pcVar7 = strstr((char *)ptVar5,"TRIANGLES"),
                      pcVar7 == (char *)0x0)) {
              ptVar9 = ptVar5;
              pcVar7 = strstr((char *)ptVar5,"Quadrilaterals");
              if (pcVar7 != (char *)0x0) {
                local_c90 = local_c90 & 0xffffffff00000000;
                uStack_cb0 = 4;
                goto LAB_0010a7cc;
              }
              ptVar9 = ptVar5;
              pcVar7 = strstr((char *)ptVar5,"quadrilaterals");
              local_c70 = 0;
              if ((pcVar7 == (char *)0x0) &&
                 (pcVar7 = strstr((char *)ptVar5,"QUADRILATERALS"), ptVar9 = ptVar5,
                 pcVar20 = (char *)ptVar5, lVar6 = local_c78, pcVar7 == (char *)0x0))
              goto LAB_0010a31c;
              local_c80 = 4;
              local_c90 = local_c90 & 0xffffffff00000000;
            }
            else {
              uStack_cb0 = 3;
LAB_0010a7cc:
              local_c80 = uStack_cb0;
            }
            pcVar20 = findnextnumber(ptVar9,pcVar7);
            lVar6 = local_c78;
            if ((char)((tetgenio *)pcVar20)->firstnumber == '\0') {
              local_ca0 = (tetgenio *)pcVar20;
              pcVar20 = readline(ptVar9,buffer,(FILE *)__stream,&line_count);
            }
            local_ca0 = (tetgenio *)pcVar20;
            local_c70 = strtol(pcVar20,(char **)&local_ca0,0);
            uVar17 = (uint)local_c70;
            if ((int)uVar17 < 1) {
LAB_0010a957:
              if (istetmesh == 0) {
                uVar21 = (ulong)(uint)this->numberoffacets;
                local_c84 = istetmesh;
LAB_0010aab5:
                local_c48 = (tetgenio *)(ulong)(uint)((int)local_c80 * 4);
                local_c60 = (long)(int)uVar21;
                local_c90 = local_c80 & 0xffffffff;
                while( true ) {
                  iVar3 = (int)uVar21 + (int)local_c70;
                  if (iVar3 <= local_c60) break;
                  ptVar5 = (tetgenio *)
                           readline((tetgenio *)pcVar20,buffer,(FILE *)__stream,&line_count);
                  lVar6 = local_c60;
                  local_ca0 = ptVar5;
                  if (ptVar5 == (tetgenio *)0x0) goto LAB_0010ad52;
                  local_c98 = this->facetlist;
                  local_c98[local_c60].polygonlist = (polygon *)0x0;
                  local_c98[local_c60].holelist = (double *)0x0;
                  local_c98[local_c60].numberofholes = 0;
                  local_c98[local_c60].numberofpolygons = 1;
                  ppVar16 = (polygon *)operator_new__(0x10);
                  local_c98[lVar6].polygonlist = ppVar16;
                  ppVar16->vertexlist = (int *)0x0;
                  ppVar16->numberofvertices = (int)local_c80;
                  pcVar20 = (char *)local_c48;
                  piVar11 = (int *)operator_new__((ulong)local_c48);
                  ppVar16->vertexlist = piVar11;
                  local_c98 = (facet *)ppVar16;
                  for (uVar21 = 0; local_c90 != uVar21; uVar21 = uVar21 + 1) {
                    if ((char)ptVar5->firstnumber == '\0') goto LAB_0010acfd;
                    lVar6 = strtol((char *)ptVar5,(char **)&local_ca0,0);
                    uVar17 = (uint)lVar6;
                    *(uint *)((long)local_c98->polygonlist + uVar21 * 4) = uVar17;
                    if ((int)uVar19 < (int)uVar17) {
                      uVar17 = uVar19;
                    }
                    uVar19 = uVar17;
                    local_ca0 = (tetgenio *)findnextnumber(ptVar5,(char *)local_ca0);
                    pcVar20 = (char *)ptVar5;
                    ptVar5 = local_ca0;
                  }
                  this->facetmarkerlist[local_c60] = 0;
                  if ((char)ptVar5->firstnumber != '\0') {
                    lVar6 = strtol((char *)ptVar5,(char **)&local_ca0,0);
                    this->facetmarkerlist[local_c60] = (int)lVar6;
                    pcVar20 = (char *)ptVar5;
                  }
                  local_c60 = local_c60 + 1;
                  uVar21 = (ulong)(uint)this->numberoffacets;
                  lVar6 = local_c78;
                }
                this->numberoffacets = iVar3;
                local_c70 = 0;
                istetmesh = local_c84;
                goto LAB_0010a31c;
              }
              if ((char)local_c90 == '\0') goto LAB_0010a31c;
            }
            else {
              if (istetmesh == 0) {
                uVar21 = (ulong)this->numberoffacets;
                local_c84 = istetmesh;
                if (0 < (long)uVar21) {
                  local_c98 = (facet *)(ulong)(this->numberoffacets + uVar17);
                  pfVar12 = (facet *)operator_new__((long)local_c98 << 5);
                  pfVar13 = (facet *)operator_new__((long)local_c98 << 2);
                  pfVar15 = this->facetlist;
                  pcVar20 = (char *)this->facetmarkerlist;
                  for (lVar6 = 0; uVar21 * 4 != lVar6; lVar6 = lVar6 + 4) {
                    (&pfVar12->polygonlist)[lVar6] = (polygon *)0x0;
                    (&pfVar12->numberofpolygons)[lVar6 * 2] = 0;
                    (&pfVar12->holelist)[lVar6] = (double *)0x0;
                    (&pfVar12->numberofholes)[lVar6 * 2] = 0;
                    ppVar16 = (&pfVar15->polygonlist)[lVar6];
                    uVar1 = (&pfVar15->polygonlist + lVar6)[1];
                    uVar2 = (&pfVar15->holelist + lVar6)[1];
                    (&pfVar12->holelist)[lVar6] = (&pfVar15->holelist)[lVar6];
                    (&pfVar12->holelist + lVar6)[1] = (double *)uVar2;
                    (&pfVar12->polygonlist)[lVar6] = ppVar16;
                    (&pfVar12->polygonlist + lVar6)[1] = (polygon *)uVar1;
                    *(undefined4 *)((long)&((polygon *)pfVar13)->vertexlist + lVar6) =
                         *(undefined4 *)((long)&((tetgenio *)pcVar20)->firstnumber + lVar6);
                  }
                  if (pfVar15 != (facet *)0x0) {
                    operator_delete__(pfVar15);
                    pcVar20 = (char *)this->facetmarkerlist;
                  }
                  istetmesh = local_c84;
                  if ((tetgenio *)pcVar20 != (tetgenio *)0x0) {
                    local_c98 = pfVar13;
                    operator_delete__(pcVar20);
                    pfVar13 = local_c98;
                  }
                  this->facetlist = pfVar12;
                  this->facetmarkerlist = (int *)pfVar13;
                  lVar6 = local_c78;
                  goto LAB_0010a957;
                }
                pfVar15 = (facet *)operator_new__((ulong)(uVar17 & 0x7fffffff) << 5);
                this->facetlist = pfVar15;
                pcVar20 = (char *)((ulong)(uVar17 & 0x7fffffff) << 2);
                piVar11 = (int *)operator_new__((ulong)pcVar20);
                this->facetmarkerlist = piVar11;
                lVar6 = local_c78;
                goto LAB_0010aab5;
              }
              if ((char)local_c90 == '\0') goto LAB_0010a31c;
              this->numberoftrifaces = uVar17;
              piVar11 = (int *)operator_new__(local_c70 * 0xc & 0x3fffffffc);
              this->trifacelist = piVar11;
              pcVar20 = (char *)((ulong)((uint)local_c70 & 0x7fffffff) << 2);
              piVar11 = (int *)operator_new__((ulong)pcVar20);
              this->trifacemarkerlist = piVar11;
            }
            local_c80 = 0;
            local_c68 = this;
            for (local_c98 = (facet *)0x0; (long)local_c98 < (long)this->numberoftrifaces;
                local_c98 = (facet *)((long)&((polygon *)local_c98)->vertexlist + 1)) {
              piVar11 = this->trifacelist;
              ptVar5 = (tetgenio *)readline((tetgenio *)pcVar20,buffer,(FILE *)__stream,&line_count)
              ;
              local_ca0 = ptVar5;
              if (ptVar5 == (tetgenio *)0x0) goto LAB_0010ad52;
              local_c90 = (long)piVar11 + local_c80;
              for (lVar6 = 0; this = local_c68, local_ca0 = ptVar5, lVar6 != 3; lVar6 = lVar6 + 1) {
                if ((char)ptVar5->firstnumber == '\0') goto LAB_0010acfd;
                lVar14 = strtol((char *)ptVar5,(char **)&local_ca0,0);
                uVar17 = (uint)lVar14;
                *(uint *)(local_c90 + lVar6 * 4) = uVar17;
                if ((int)uVar19 < (int)uVar17) {
                  uVar17 = uVar19;
                }
                uVar19 = uVar17;
                pcVar20 = (char *)ptVar5;
                ptVar5 = (tetgenio *)findnextnumber(ptVar5,(char *)local_ca0);
              }
              local_c68->trifacemarkerlist[(long)local_c98] = 0;
              if ((char)ptVar5->firstnumber != '\0') {
                lVar6 = strtol((char *)ptVar5,(char **)&local_ca0,0);
                this->trifacemarkerlist[(long)local_c98] = (int)lVar6;
                pcVar20 = (char *)ptVar5;
              }
              local_c80 = local_c80 + 0xc;
              lVar6 = local_c78;
            }
          }
        }
        goto LAB_0010a31c;
      }
      fclose(__stream);
      if (uVar19 < 2) {
        this->firstnumber = uVar19;
        bVar22 = true;
      }
      else {
        bVar22 = false;
        printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)uVar19,infilename);
      }
    }
  }
  return bVar22;
LAB_0010acfd:
  uVar21 = (ulong)(uint)line_count;
  pcVar20 = "Syntax error reading face on line %d in file %s\n";
  goto LAB_0010ad0b;
LAB_0010ad52:
  uVar21 = (ulong)(uint)line_count;
  pcVar20 = "Unexpected end of file on line %d in file %s\n";
LAB_0010ad0b:
  printf(pcVar20,uVar21,infilename);
  fclose(__stream);
  return false;
}

Assistant:

bool tetgenio::load_medit(char* filebasename, int istetmesh)
{
  FILE *fp;
  tetgenio::facet *tmpflist, *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char buffer[INPUTLINESIZE];
  char *bufferp, *str;
  double *coord;
  int *tmpfmlist;
  int dimension = 0;
  int nverts = 0;
  int nfaces = 0;
  int ntets = 0;
  int line_count = 0;
  int corners = 0; // 3 (triangle) or 4 (quad).
  int *plist;
  int i, j;

  int smallestidx = 0;

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 5], ".mesh") != 0) {
    strcat(infilename, ".mesh");
  }
  
  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  while ((bufferp = readline(buffer, fp, &line_count)) != NULL) {
    if (*bufferp == '#') continue;  // A comment line is skipped.
    if (dimension == 0) {
      // Find if it is the keyword "Dimension".
      str = strstr(bufferp, "Dimension");
      if (!str) str = strstr(bufferp, "dimension");
      if (!str) str = strstr(bufferp, "DIMENSION");
      if (str) {
        // Read the dimensions
        bufferp = findnextnumber(str); // Skip field "Dimension".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        dimension = (int) strtol(bufferp, &bufferp, 0);
        if (dimension != 2 && dimension != 3) {
          printf("Unknown dimension in file on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        mesh_dim = dimension;
      }
    }
    if (nverts == 0) {
      // Find if it is the keyword "Vertices".
      str = strstr(bufferp, "Vertices");
      if (!str) str = strstr(bufferp, "vertices");
      if (!str) str = strstr(bufferp, "VERTICES");
      if (str) {
        // Read the number of vertices.
        bufferp = findnextnumber(str); // Skip field "Vertices".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        nverts = (int) strtol(bufferp, &bufferp, 0);
        // Initialize the smallest index.
        smallestidx = nverts + 1;
        // Allocate memory for 'tetgenio'
        if (nverts > 0) {
          numberofpoints = nverts;
          pointlist = new REAL[nverts * 3];
        }
        // Read the follwoing node list.
        for (i = 0; i < nverts; i++) {
          bufferp = readline(buffer, fp, &line_count);
          if (bufferp == NULL) {
            printf("Unexpected end of file on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          // Read vertex coordinates
          coord = &pointlist[i * 3];
          for (j = 0; j < 3; j++) {
            if (*bufferp == '\0') {
              printf("Syntax error reading vertex coords on line");
              printf(" %d in file %s\n", line_count, infilename);
              fclose(fp);
              return false;
            }
            if ((j < 2) || (dimension == 3)) {
              coord[j] = (REAL) strtod(bufferp, &bufferp);
            } else {
              coord[j] = 0.0;
            }
            bufferp = findnextnumber(bufferp);
          }
        }
        continue;
      }
    }
    if (ntets == 0) {
      // Find if it is the keyword "Tetrahedra"
      corners = 0;
      str = strstr(bufferp, "Tetrahedra");
      if (!str) str = strstr(bufferp, "tetrahedra");
      if (!str) str = strstr(bufferp, "TETRAHEDRA");
      if (str) {
        corners = 4;
      }
      if (corners == 4) {
        // Read the number of tetrahedra
        bufferp = findnextnumber(str); // Skip field "Tetrahedra".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        ntets = strtol(bufferp, &bufferp, 0);
        if (ntets > 0) {
          // It is a tetrahedral mesh.
          numberoftetrahedra = ntets;
          numberofcorners = 4;
          numberoftetrahedronattributes = 1;
          tetrahedronlist = new int[ntets * 4];
          tetrahedronattributelist = new REAL[ntets];
        }
      } // if (corners == 4)
      // Read the list of tetrahedra.
      for (i = 0; i < numberoftetrahedra; i++) {
        plist = &(tetrahedronlist[i * 4]);
        bufferp = readline(buffer, fp, &line_count);
        if (bufferp == NULL) {
          printf("Unexpected end of file on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        // Read the vertices of the tet.
        for (j = 0; j < corners; j++) {
          if (*bufferp == '\0') {
            printf("Syntax error reading face on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          plist[j] = (int) strtol(bufferp, &bufferp, 0);
          // Remember the smallest index.
          if (plist[j] < smallestidx) smallestidx = plist[j];
          bufferp = findnextnumber(bufferp);
        }
        // Read the attribute of the tet if it exists.
        tetrahedronattributelist[i] = 0;
        if (*bufferp != '\0') {
          tetrahedronattributelist[i] = (REAL) strtol(bufferp, &bufferp, 0);
        }
      } // i
    } // Tetrahedra
    if (nfaces == 0) {
      // Find if it is the keyword "Triangles" or "Quadrilaterals".
      corners = 0;
      str = strstr(bufferp, "Triangles");
      if (!str) str = strstr(bufferp, "triangles");
      if (!str) str = strstr(bufferp, "TRIANGLES");
      if (str) {
        corners = 3;
      } else {
        str = strstr(bufferp, "Quadrilaterals");
        if (!str) str = strstr(bufferp, "quadrilaterals");
        if (!str) str = strstr(bufferp, "QUADRILATERALS");
        if (str) {
          corners = 4;
        }
      }
      if (corners == 3 || corners == 4) {
        // Read the number of triangles (or quadrilaterals).
        bufferp = findnextnumber(str); // Skip field "Triangles".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        nfaces = strtol(bufferp, &bufferp, 0);
        // Allocate memory for 'tetgenio'
        if (nfaces > 0) {
          if (!istetmesh) {
            // It is a PLC surface mesh.
            if (numberoffacets > 0) {
              // facetlist has already been allocated. Enlarge arrays.
              // This happens when the surface mesh contains mixed cells.
              tmpflist = new tetgenio::facet[numberoffacets + nfaces];
              tmpfmlist = new int[numberoffacets + nfaces];
              // Copy the data of old arrays into new arrays.
              for (i = 0; i < numberoffacets; i++) {
                f = &(tmpflist[i]);
                tetgenio::init(f);
                *f = facetlist[i];
                tmpfmlist[i] = facetmarkerlist[i];
              }
              // Release old arrays.
              delete [] facetlist;
              delete [] facetmarkerlist;
              // Remember the new arrays.
              facetlist = tmpflist;
              facetmarkerlist = tmpfmlist;
            } else {
              // This is the first time to allocate facetlist.
              facetlist = new tetgenio::facet[nfaces];
              facetmarkerlist = new int[nfaces];
            }
          } else {
            if (corners == 3) {
              // It is a surface mesh of a tetrahedral mesh.
              numberoftrifaces = nfaces;
              trifacelist = new int[nfaces * 3];
              trifacemarkerlist = new int[nfaces];
            }
          }
        } // if (nfaces > 0)
        // Read the following list of faces.
        if (!istetmesh) {
          for (i = numberoffacets; i < numberoffacets + nfaces; i++) {
            bufferp = readline(buffer, fp, &line_count);
            if (bufferp == NULL) {
              printf("Unexpected end of file on line %d in file %s\n",
                     line_count, infilename);
              fclose(fp);
              return false;
            }
            f = &facetlist[i];
            tetgenio::init(f);
            // In .mesh format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            tetgenio::init(p);
            p->numberofvertices = corners;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            // Read the vertices of the face.
            for (j = 0; j < corners; j++) {
              if (*bufferp == '\0') {
                printf("Syntax error reading face on line %d in file %s\n",
                       line_count, infilename);
                fclose(fp);
                return false;
              }
              p->vertexlist[j] = (int) strtol(bufferp, &bufferp, 0);
              // Remember the smallest index.
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
              bufferp = findnextnumber(bufferp);
            }
            // Read the marker of the face if it exists.
            facetmarkerlist[i] = 0;
            if (*bufferp != '\0') {
              facetmarkerlist[i] = (int) strtol(bufferp, &bufferp, 0);
            }
          }
          // Have read in a list of triangles/quads.
          numberoffacets += nfaces;
          nfaces = 0;
        } else {
          // It is a surface mesh of a tetrahedral mesh.
          if (corners == 3) {
            for (i = 0; i < numberoftrifaces; i++) {
              plist = &(trifacelist[i * 3]);
              bufferp = readline(buffer, fp, &line_count);
              if (bufferp == NULL) {
                printf("Unexpected end of file on line %d in file %s\n",
                       line_count, infilename);
                fclose(fp);
                return false;
              }
              // Read the vertices of the face.
              for (j = 0; j < corners; j++) {
                if (*bufferp == '\0') {
                  printf("Syntax error reading face on line %d in file %s\n",
                         line_count, infilename);
                  fclose(fp);
                  return false;
                }
                plist[j] = (int) strtol(bufferp, &bufferp, 0);
                // Remember the smallest index.
                if (plist[j] < smallestidx) {
                  smallestidx = plist[j];
                }
                bufferp = findnextnumber(bufferp);
              }
              // Read the marker of the face if it exists.
              trifacemarkerlist[i] = 0;
              if (*bufferp != '\0') {
                trifacemarkerlist[i] = (int) strtol(bufferp, &bufferp, 0);
              }
            } // i
          } // if (corners == 3)
        } // if (b->refine)
      } // if (corners == 3 || corners == 4)
    }
  }

  // Close file
  fclose(fp);

  // Decide the firstnumber of the index.
  if (smallestidx == 0) {
    firstnumber = 0;  
  } else if (smallestidx == 1) {
    firstnumber = 1;
  } else {
    printf("A wrong smallest index (%d) was detected in file %s\n",
           smallestidx, infilename);
    return false;
  }

  return true;
}